

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folded_integer_bit_decoder.h
# Opt level: O0

void __thiscall
draco::FoldedBit32Decoder<draco::RAnsBitDecoder>::DecodeLeastSignificantBits32
          (FoldedBit32Decoder<draco::RAnsBitDecoder> *this,int nbits,uint32_t *value)

{
  bool bVar1;
  int *in_RDX;
  int in_ESI;
  array<draco::RAnsBitDecoder,_32UL> *in_RDI;
  bool bit;
  int i;
  uint32_t result;
  size_type in_stack_ffffffffffffffc8;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    std::array<draco::RAnsBitDecoder,_32UL>::operator[](in_RDI,in_stack_ffffffffffffffc8);
    bVar1 = RAnsBitDecoder::DecodeNextBit((RAnsBitDecoder *)in_RDI);
    local_1c = local_1c * 2 + (uint)bVar1;
  }
  *in_RDX = local_1c;
  return;
}

Assistant:

void DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
    uint32_t result = 0;
    for (int i = 0; i < nbits; ++i) {
      const bool bit = folded_number_decoders_[i].DecodeNextBit();
      result = (result << 1) + bit;
    }
    *value = result;
  }